

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O2

void __thiscall
helics::PotentialInterfacesManager::PotentialInterfacesManager
          (PotentialInterfacesManager *this,Core *core,Federate *fed)

{
  _Rb_tree_header *p_Var1;
  
  this->corePtr = core;
  this->fedPtr = fed;
  this->respondedToCommand = (__atomic_base<bool>)0x0;
  this->hasPotentialTargetting = true;
  p_Var1 = &(this->potInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header;
  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Deque_base(&(this->extraCommands).
                 super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               );
  return;
}

Assistant:

PotentialInterfacesManager::PotentialInterfacesManager(Core* core, Federate* fed):
    corePtr(core), fedPtr(fed)
{
}